

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O2

bool __thiscall
CServerBrowserFavorites::AddFavoriteEx
          (CServerBrowserFavorites *this,char *pHostname,NETADDR *pAddr,bool DoCheck,char *pPassword
          )

{
  NETADDR *pNVar1;
  long lVar2;
  undefined8 uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  int iVar8;
  CFavoriteServer *pCVar9;
  long lVar10;
  int *piVar11;
  char *dst;
  bool bVar12;
  long in_FS_OFFSET;
  bool bVar13;
  char aBuf [256];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_NumFavoriteServers != 0x100) {
    pCVar9 = FindFavoriteByHostname(this,pHostname,(int *)0x0);
    if (pCVar9 == (CFavoriteServer *)0x0) {
      iVar8 = net_addr_from_str(&this->m_aFavoriteServers[this->m_NumFavoriteServers].m_Addr,
                                pHostname);
      lVar10 = (long)this->m_NumFavoriteServers;
      bVar13 = iVar8 == 0;
      if (bVar13) {
        pCVar9 = FindFavoriteByAddr(this,&this->m_aFavoriteServers[lVar10].m_Addr,(int *)0x0);
        bVar12 = false;
        if (pCVar9 != (CFavoriteServer *)0x0) goto LAB_00123ea5;
        if ((DoCheck) &&
           (iVar8 = net_addr_comp(&this->m_aFavoriteServers[this->m_NumFavoriteServers].m_Addr,pAddr
                                  ,1), iVar8 != 0)) goto LAB_00123ea2;
        lVar10 = (long)this->m_NumFavoriteServers;
        this->m_aFavoriteServers[lVar10].m_State = 3;
      }
      else {
        piVar11 = &this->m_aFavoriteServers[lVar10].m_State;
        if (DoCheck) {
          *piVar11 = 1;
          *(undefined8 *)(this->m_aFavoriteServers[lVar10].m_Addr.ip + 0xc) =
               *(undefined8 *)(pAddr->ip + 0xc);
          uVar4 = pAddr->ip[0];
          uVar5 = pAddr->ip[1];
          uVar6 = pAddr->ip[2];
          uVar7 = pAddr->ip[3];
          uVar3 = *(undefined8 *)(pAddr->ip + 4);
          pNVar1 = &this->m_aFavoriteServers[lVar10].m_Addr;
          pNVar1->type = pAddr->type;
          pNVar1->ip[0] = uVar4;
          pNVar1->ip[1] = uVar5;
          pNVar1->ip[2] = uVar6;
          pNVar1->ip[3] = uVar7;
          *(undefined8 *)(pNVar1->ip + 4) = uVar3;
        }
        else {
          *piVar11 = 0;
        }
        piVar11 = &(this->m_FavLookup).m_LookupCount;
        *piVar11 = *piVar11 + 1;
      }
      str_copy(this->m_aFavoriteServers[lVar10].m_aHostname,pHostname,0x80);
      iVar8 = this->m_NumFavoriteServers;
      dst = this->m_aFavoriteServers[iVar8].m_aPassword;
      if (pPassword == (char *)0x0) {
        *dst = '\0';
      }
      else {
        str_copy(dst,pPassword,0x20);
        iVar8 = this->m_NumFavoriteServers;
      }
      this->m_NumFavoriteServers = iVar8 + 1;
      bVar12 = bVar13;
      if (this->m_pConfig->m_Debug != 0) {
        str_format(aBuf,0x100,"added fav \'%s\'",pHostname);
        (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                  (this->m_pConsole,2,"client_srvbrowse",aBuf,0);
      }
      goto LAB_00123ea5;
    }
    if (pPassword == (char *)0x0) {
      pCVar9->m_aPassword[0] = '\0';
    }
    else {
      str_copy(pCVar9->m_aPassword,pPassword,0x20);
    }
  }
LAB_00123ea2:
  bVar12 = false;
LAB_00123ea5:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar12;
}

Assistant:

bool CServerBrowserFavorites::AddFavoriteEx(const char *pHostname, const NETADDR *pAddr, bool DoCheck, const char *pPassword)
{
	if(m_NumFavoriteServers == MAX_FAVORITES)
		return false;

	CFavoriteServer *pExistingFavorite = FindFavoriteByHostname(pHostname, 0);
	if(pExistingFavorite)
	{
		if(pPassword)
			str_copy(pExistingFavorite->m_aPassword, pPassword, sizeof(pExistingFavorite->m_aPassword));
		else
			pExistingFavorite->m_aPassword[0] = '\0';
		return false;
	}

	bool Result = false;
	// check if hostname is a net address string
	if(net_addr_from_str(&m_aFavoriteServers[m_NumFavoriteServers].m_Addr, pHostname) == 0)
	{
		// make sure that we don't already have the server in our list
		if(FindFavoriteByAddr(m_aFavoriteServers[m_NumFavoriteServers].m_Addr, 0) != 0)
			return false;

		// check if hostname does not match given address
		if(DoCheck && net_addr_comp(&m_aFavoriteServers[m_NumFavoriteServers].m_Addr, pAddr, true) != 0)
			return false;

		// add the server to the list
		m_aFavoriteServers[m_NumFavoriteServers].m_State = FAVSTATE_ADDR;
		Result = true;
	}
	else
	{
		// prepare for hostname lookup
		if(DoCheck)
		{
			m_aFavoriteServers[m_NumFavoriteServers].m_State = FAVSTATE_LOOKUPCHECK;
			m_aFavoriteServers[m_NumFavoriteServers].m_Addr = *pAddr;
		}
		else
			m_aFavoriteServers[m_NumFavoriteServers].m_State = FAVSTATE_LOOKUP;
		++m_FavLookup.m_LookupCount;
	}

	str_copy(m_aFavoriteServers[m_NumFavoriteServers].m_aHostname, pHostname, sizeof(m_aFavoriteServers[m_NumFavoriteServers].m_aHostname));

	if(pPassword)
		str_copy(m_aFavoriteServers[m_NumFavoriteServers].m_aPassword, pPassword, sizeof(m_aFavoriteServers[m_NumFavoriteServers].m_aPassword));
	else
		m_aFavoriteServers[m_NumFavoriteServers].m_aPassword[0] = '\0';

	++m_NumFavoriteServers;

	if(m_pConfig->m_Debug)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "added fav '%s'", pHostname);
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client_srvbrowse", aBuf);
	}

	return Result;
}